

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkResVtolerance(ARKodeMem ark_mem,N_Vector rabstol)

{
  int iVar1;
  ARKodeMem in_RSI;
  ARKodeMem in_RDI;
  N_Vector tmpl;
  realtype rabstolmin;
  N_Vector in_stack_ffffffffffffffd8;
  N_Vector in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkResVtolerance","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->MallocDone == 0) {
    arkProcessError(in_RDI,-0x17,"ARKode","arkResVtolerance","Attempt to call before ARKodeInit.");
    local_4 = -0x17;
  }
  else if (in_RSI == (ARKodeMem)0x0) {
    arkProcessError(in_RDI,-0x17,"ARKode","arkResVtolerance","rabstol = NULL illegal.");
    local_4 = -0x17;
  }
  else if (*(long *)((long)in_RSI->uround + 0xb0) == 0) {
    arkProcessError(in_RDI,-0x16,"ARKode","arkResVtolerance","Missing N_VMin routine from N_Vector")
    ;
    local_4 = -0x16;
  }
  else {
    tmpl = (N_Vector)N_VMin(in_stack_ffffffffffffffe0);
    if (0.0 <= (double)tmpl) {
      in_RDI->Ratolmin0 = (uint)((double)tmpl == 0.0);
      if (in_RDI->rwt_is_ewt != 0) {
        in_RDI->rwt = (N_Vector)0x0;
        iVar1 = arkAllocVec(in_RSI,tmpl,(N_Vector *)in_stack_ffffffffffffffd8);
        if (iVar1 == 0) {
          arkProcessError(in_RDI,-0x14,"ARKode","arkResVtolerances",
                          "Allocation of arkode_mem failed.");
          return -0x16;
        }
        in_RDI->rwt_is_ewt = 0;
      }
      if (in_RDI->VRabstolMallocDone == 0) {
        iVar1 = arkAllocVec(in_RSI,tmpl,(N_Vector *)in_stack_ffffffffffffffd8);
        if (iVar1 == 0) {
          arkProcessError(in_RDI,-0x14,"ARKode","arkResStolerances",
                          "Allocation of arkode_mem failed.");
          return -0x16;
        }
        in_RDI->VRabstolMallocDone = 1;
      }
      N_VScale((realtype)tmpl,in_stack_ffffffffffffffd8,(N_Vector)0x115de8d);
      in_RDI->ritol = 1;
      in_RDI->user_efun = 0;
      in_RDI->rfun = arkRwtSet;
      in_RDI->r_data = in_RDI;
      local_4 = 0;
    }
    else {
      arkProcessError(in_RDI,-0x16,"ARKode","arkResVtolerance",
                      "rabstol has negative component(s) (illegal).");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int arkResVtolerance(ARKodeMem ark_mem, N_Vector rabstol)
{
  /* local variables */
  realtype rabstolmin;

  /* Check inputs */
  if (ark_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkResVtolerance", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode",
                    "arkResVtolerance", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }
  if (rabstol == NULL) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode",
                    "arkResVtolerance", MSG_ARK_NULL_RABSTOL);
    return(ARK_NO_MALLOC);
  }
  if (rabstol->ops->nvmin == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkResVtolerance",
                   "Missing N_VMin routine from N_Vector");
    return(ARK_ILL_INPUT);
  }
  rabstolmin = N_VMin(rabstol);
  if (rabstolmin < ZERO) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkResVtolerance", MSG_ARK_BAD_RABSTOL);
    return(ARK_ILL_INPUT);
  }

  /* Set flag indicating whether min(abstol) == 0 */
  ark_mem->Ratolmin0 = (rabstolmin == ZERO);

  /* Allocate space for rwt if necessary */
  if (ark_mem->rwt_is_ewt) {
    ark_mem->rwt = NULL;
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(ark_mem->rwt))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                      "arkResVtolerances", MSG_ARK_ARKMEM_FAIL);
      return(ARK_ILL_INPUT);
    }
    ark_mem->rwt_is_ewt = SUNFALSE;
  }

  /* Copy tolerances into memory */
  if ( !(ark_mem->VRabstolMallocDone) ) {
    if (!arkAllocVec(ark_mem, ark_mem->rwt, &(ark_mem->VRabstol))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                      "arkResStolerances", MSG_ARK_ARKMEM_FAIL);
      return(ARK_ILL_INPUT);
    }
    ark_mem->VRabstolMallocDone = SUNTRUE;
  }
  N_VScale(ONE, rabstol, ark_mem->VRabstol);
  ark_mem->ritol = ARK_SV;


  /* enforce use of arkRwtSet */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->rfun      = arkRwtSet;
  ark_mem->r_data    = ark_mem;

  return(ARK_SUCCESS);
}